

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O3

void bng_bout2(t_bng *x)

{
  undefined1 *puVar1;
  t_pd *x_00;
  
  if (((x->x_gui).x_fsf.field_0x3 & 4) == 0) {
    puVar1 = &(x->x_gui).x_isa.field_0x3;
    *puVar1 = *puVar1 | 8;
    clock_delay(x->x_clock_lck,2.0);
  }
  outlet_bang((x->x_gui).x_obj.te_outlet);
  if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
     (x_00 = ((x->x_gui).x_snd)->s_thing, x_00 != (t_pd *)0x0)) {
    pd_bang(x_00);
    return;
  }
  return;
}

Assistant:

static void bng_bout2(t_bng *x) /* wird immer gesendet, wenn moeglich*/
{
    if(!x->x_gui.x_fsf.x_put_in2out)
    {
        x->x_gui.x_isa.x_locked = 1;
        clock_delay(x->x_clock_lck, 2);
    }
    outlet_bang(x->x_gui.x_obj.ob_outlet);
    if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
        pd_bang(x->x_gui.x_snd->s_thing);
}